

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_18fc05::SQLiteBuildDB::setRuleResult
          (SQLiteBuildDB *this,KeyID keyID,Rule *rule,Result *ruleResult,string *error_out)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer puVar3;
  int iVar4;
  DBKeyID DVar5;
  DBKeyID DVar6;
  uint uVar7;
  int __oflag;
  void *__buf;
  bool bVar8;
  KeyIDAndFlags KVar9;
  const_iterator __begin2;
  BinaryEncoder encoder;
  
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x25d,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::setRuleResult(KeyID, const Rule &, const Result &, std::string *)"
                 );
  }
  std::mutex::lock(&this->dbMutex);
  iVar4 = open(this,(char *)error_out,__oflag);
  if (((char)iVar4 == '\0') ||
     (DVar5 = getKeyID(this,keyID,error_out), error_out->_M_string_length != 0)) {
    bVar8 = false;
    goto LAB_0014ebb8;
  }
  encoder.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
       &encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>;
  __begin2.object = &ruleResult->dependencies;
  __begin2.index = 0;
  encoder.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  encoder.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 0x100;
  pKVar1 = (ruleResult->dependencies).keys.
           super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar2 = (ruleResult->dependencies).keys.
           super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; __begin2.index != (long)pKVar1 - (long)pKVar2 >> 3; __begin2.index = __begin2.index + 1) {
    KVar9 = llbuild::core::DependencyKeyIDs::const_iterator::operator*(&__begin2);
    DVar6 = getKeyID(this,KVar9.keyID._value,error_out);
    if (error_out->_M_string_length != 0) goto LAB_0014eca2;
    uVar7 = (uint)(KVar9._8_8_ >> 7) & 2;
    llbuild::basic::BinaryEncoder::write
              (&encoder,KVar9._8_4_ & 1 | uVar7 + (int)DVar6.value * 4,__buf,(ulong)uVar7);
  }
  iVar4 = sqlite3_reset(this->insertIntoRuleResultsStmt);
  if (iVar4 == 0) {
    iVar4 = sqlite3_clear_bindings(this->insertIntoRuleResultsStmt);
    if (((((iVar4 == 0) &&
          (iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,1,DVar5.value), iVar4 == 0))
         && (puVar3 = (ruleResult->value).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
            iVar4 = sqlite3_bind_blob(this->insertIntoRuleResultsStmt,2,puVar3,
                                      *(int *)&(ruleResult->value).
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                      (int)puVar3,0), iVar4 == 0)) &&
        ((iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,3,(ruleResult->signature).value
                                    ), iVar4 == 0 &&
         (iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,4,ruleResult->builtAt),
         iVar4 == 0)))) &&
       ((iVar4 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,5,ruleResult->computedAt),
        iVar4 == 0 &&
        (iVar4 = sqlite3_bind_double(ruleResult->start,this->insertIntoRuleResultsStmt,6),
        iVar4 == 0)))) {
      iVar4 = sqlite3_bind_double(ruleResult->end,this->insertIntoRuleResultsStmt,7);
      if ((iVar4 != 0) ||
         (iVar4 = sqlite3_bind_blob(this->insertIntoRuleResultsStmt,8,
                                    encoder.encdata.super_SmallVectorImpl<unsigned_char>.
                                    super_SmallVectorTemplateBase<unsigned_char,_true>.
                                    super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                    super_SmallVectorBase.BeginX,
                                    encoder.encdata.super_SmallVectorImpl<unsigned_char>.
                                    super_SmallVectorTemplateBase<unsigned_char,_true>.
                                    super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                    super_SmallVectorBase._8_8_ & 0xffffffff,0), iVar4 != 0))
      goto LAB_0014ec7f;
      iVar4 = sqlite3_step(this->insertIntoRuleResultsStmt);
      bVar8 = true;
      if (iVar4 != 0x65) goto LAB_0014ed6b;
    }
    else {
LAB_0014ed6b:
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                ((string *)&__begin2,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&__begin2);
      std::__cxx11::string::_M_dispose();
      bVar8 = false;
    }
  }
  else {
LAB_0014ec7f:
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
              ((string *)&__begin2,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&__begin2);
    std::__cxx11::string::_M_dispose();
LAB_0014eca2:
    bVar8 = false;
  }
  llvm::SmallVectorImpl<unsigned_char>::~SmallVectorImpl((SmallVectorImpl<unsigned_char> *)&encoder)
  ;
LAB_0014ebb8:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar8;
}

Assistant:

virtual bool setRuleResult(KeyID keyID,
                             const Rule& rule,
                             const Result& ruleResult,
                             std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    int result;

    if (!open(error_out)) {
      return false;
    }

    auto dbKeyID = getKeyID(keyID, error_out);
    if (!error_out->empty()) {
      return false;
    }

    // Create the encoded dependency list.
    //
    // FIXME: We could save some reallocation by having a templated SmallVector
    // size here.
    basic::BinaryEncoder encoder{};
    for (auto dependency: ruleResult.dependencies) {
      // Map the enging keyID to a database key ID
      //
      // FIXME: This is naively mapping all keys with no caching at this point,
      // thus likely to perform poorly.  Should refactor this into a bulk
      // query or a DB layer cache.
      auto dbKeyID = getKeyID(dependency.keyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      encoder.write((dbKeyID.value << 2) + (dependency.singleUse << 1) + dependency.orderOnly);
    }

    // Insert the actual rule result.
    result = sqlite3_reset(insertIntoRuleResultsStmt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_clear_bindings(insertIntoRuleResultsStmt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/1,
                               dbKeyID.value);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_blob(insertIntoRuleResultsStmt, /*index=*/2,
                               ruleResult.value.data(),
                               ruleResult.value.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/3,
                               ruleResult.signature.value);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/4,
                                ruleResult.builtAt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/5,
                                ruleResult.computedAt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_double(insertIntoRuleResultsStmt, /*index=*/6,
                                ruleResult.start);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_double(insertIntoRuleResultsStmt, /*index=*/7,
                                ruleResult.end);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_blob(insertIntoRuleResultsStmt, /*index=*/8,
                               encoder.data(),
                               encoder.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_step(insertIntoRuleResultsStmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      return false;
    }

    return true;
  }